

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

int Cbs_ManResolve(Cbs_Man_t *p,int Level,int hClause0,int hClause1)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Cbs_Que_t *p_00;
  int local_38;
  int LevelCur;
  int LevelMax;
  int i;
  Gia_Obj_t *pObj;
  Cbs_Que_t *pQue;
  int hClause1_local;
  int hClause0_local;
  int Level_local;
  Cbs_Man_t *p_local;
  
  p_00 = &p->pClauses;
  local_38 = -1;
  if ((p->pClauses).pData[hClause0] == (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[hClause0] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x2b9,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
  }
  if ((p->pClauses).pData[hClause0] != (p->pClauses).pData[hClause1]) {
    __assert_fail("pQue->pData[hClause0] == pQue->pData[hClause1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x2ba,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
  }
  iVar2 = Cbs_QueIsEmpty(p_00);
  if (iVar2 == 0) {
    __assert_fail("Cbs_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x2c1,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
  }
  Cbs_QuePush(p_00,(Gia_Obj_t *)0x0);
  for (LevelCur = hClause0 + 1; pGVar1 = (p->pClauses).pData[LevelCur], pGVar1 != (Gia_Obj_t *)0x0;
      LevelCur = LevelCur + 1) {
    if ((*(ulong *)pGVar1 >> 0x1e & 1) != 0) {
      *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0xffffffffbfffffff;
      Cbs_QuePush(p_00,pGVar1);
      iVar2 = Cbs_VarDecLevel(p,pGVar1);
      if (local_38 < iVar2) {
        local_38 = iVar2;
      }
    }
  }
  for (LevelCur = hClause1 + 1; pGVar1 = (p->pClauses).pData[LevelCur], pGVar1 != (Gia_Obj_t *)0x0;
      LevelCur = LevelCur + 1) {
    if ((*(ulong *)pGVar1 >> 0x1e & 1) != 0) {
      *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0xffffffffbfffffff;
      Cbs_QuePush(p_00,pGVar1);
      iVar2 = Cbs_VarDecLevel(p,pGVar1);
      if (local_38 < iVar2) {
        local_38 = iVar2;
      }
    }
  }
  LevelCur = p_00->iHead;
  while (LevelCur = LevelCur + 1, LevelCur < (p->pClauses).iTail) {
    pGVar1 = (p->pClauses).pData[LevelCur];
    *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0xffffffffbfffffff | 0x40000000;
  }
  Cbs_ManDeriveReason(p,local_38);
  iVar2 = Cbs_QueFinish(p_00);
  return iVar2;
}

Assistant:

static inline int Cbs_ManResolve( Cbs_Man_t * p, int Level, int hClause0, int hClause1 )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj;
    int i, LevelMax = -1, LevelCur;
    assert( pQue->pData[hClause0] != NULL );
    assert( pQue->pData[hClause0] == pQue->pData[hClause1] );
/*
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fMark0 == 1 );
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fMark0 == 1 );
*/
    assert( Cbs_QueIsEmpty( pQue ) );
    Cbs_QuePush( pQue, NULL );
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Cbs_QuePush( pQue, pObj );
        LevelCur = Cbs_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Cbs_QuePush( pQue, pObj );
        LevelCur = Cbs_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
        pQue->pData[i]->fMark0 = 1;
    Cbs_ManDeriveReason( p, LevelMax );
    return Cbs_QueFinish( pQue );
}